

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wb_tree.c
# Opt level: O2

dict_insert_result wb_tree_insert(wb_tree *tree,void *key)

{
  wb_node *pwVar1;
  uint uVar2;
  uint uVar3;
  wb_tree *pwVar4;
  long lVar5;
  wb_node *pwVar6;
  size_t sVar7;
  undefined8 uVar8;
  undefined8 extraout_RDX;
  char *pcVar9;
  wb_node *n;
  void **ppvVar10;
  undefined1 auVar11 [16];
  dict_insert_result dVar12;
  
  uVar2 = 0;
  pwVar4 = tree;
  n = (wb_node *)0x0;
  while (pwVar6 = pwVar4->root, pwVar6 != (wb_node *)0x0) {
    uVar2 = (*tree->cmp_func)(key,pwVar6->key);
    lVar5 = 0x18;
    if (-1 < (int)uVar2) {
      lVar5 = 0x20;
      if (uVar2 == 0) {
        ppvVar10 = &pwVar6->datum;
        goto LAB_001059fd;
      }
    }
    n = pwVar6;
    pwVar4 = (wb_tree *)((long)&pwVar6->key + lVar5);
  }
  auVar11 = (undefined1  [16])(*dict_malloc_func)(0x30);
  uVar8 = auVar11._8_8_;
  pwVar6 = auVar11._0_8_;
  if (pwVar6 == (wb_node *)0x0) {
    ppvVar10 = (void **)0x0;
LAB_001059fd:
    uVar8 = 0;
  }
  else {
    pwVar6->key = key;
    pwVar6->datum = (void *)0x0;
    pwVar6->parent = (wb_node *)0x0;
    pwVar6->llink = (wb_node *)0x0;
    pwVar6->rlink = (wb_node *)0x0;
    pwVar6->weight = 2;
    pwVar6->parent = n;
    if (n == (wb_node *)0x0) {
      if (tree->count != 0) {
        pcVar9 = "tree->count == 0";
        uVar8 = 0x100;
LAB_00105a88:
        fprintf(_stderr,"\n%s:%d (%s) assertion failed: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cafaro[P]UDDSketch/libuddsketch/src/dict/wb_tree.c"
                ,uVar8,"wb_tree_insert",pcVar9);
        abort();
      }
      if (tree->root != (wb_node *)0x0) {
        pcVar9 = "tree->root == NULL";
        uVar8 = 0x101;
        goto LAB_00105a88;
      }
      tree->root = pwVar6;
      sVar7 = 1;
    }
    else {
      (&n->llink)[~uVar2 >> 0x1f] = pwVar6;
      uVar2 = 0;
      while (n != (wb_node *)0x0) {
        pwVar1 = n->parent;
        n->weight = n->weight + 1;
        uVar3 = fixup(tree,n);
        uVar2 = uVar2 + uVar3;
        uVar8 = extraout_RDX;
        n = pwVar1;
      }
      tree->rotation_count = tree->rotation_count + (ulong)uVar2;
      sVar7 = tree->count + 1;
    }
    ppvVar10 = &pwVar6->datum;
    tree->count = sVar7;
    uVar8 = CONCAT71((int7)((ulong)uVar8 >> 8),1);
  }
  dVar12._8_8_ = uVar8;
  dVar12.datum_ptr = ppvVar10;
  return dVar12;
}

Assistant:

dict_insert_result
wb_tree_insert(wb_tree* tree, void* key)
{
    int cmp = 0;

    wb_node* node = tree->root;
    wb_node* parent = NULL;
    while (node) {
	cmp = tree->cmp_func(key, node->key);
	if (cmp < 0) {
	    parent = node; node = node->llink;
	} else if (cmp) {
	    parent = node; node = node->rlink;
	} else
	    return (dict_insert_result) { &node->datum, false };
    }

    wb_node* const add = node = node_new(key);
    if (!add)
	return (dict_insert_result) { NULL, false };

    if (!(node->parent = parent)) {
	ASSERT(tree->count == 0);
	ASSERT(tree->root == NULL);
	tree->root = node;
    } else {
	if (cmp < 0)
	    parent->llink = node;
	else
	    parent->rlink = node;

	unsigned rotations = 0;
	while ((node = parent) != NULL) {
	    parent = node->parent;
	    ++node->weight;
	    rotations += fixup(tree, node);
	}
	tree->rotation_count += rotations;
    }
    tree->count++;
    return (dict_insert_result) { &add->datum, true };
}